

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  int y;
  int iVar3;
  float *pfVar4;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float val_2;
  int k_1;
  float sum_2;
  float *sptr_1;
  int j_3;
  int i_5;
  float *outptr_2;
  Mat m_2;
  int q_4;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  float sum_1;
  int sx0;
  int j_2;
  int sy0;
  int i_4;
  float *outptr_1;
  Mat m_1;
  int q_3;
  int htailpad;
  int wtailpad;
  float val;
  int k;
  float max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr;
  Mat m;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffbe0;
  int iVar6;
  Mat *in_stack_fffffffffffffbe8;
  allocator_type *in_stack_fffffffffffffbf0;
  size_type in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  int local_390;
  float local_38c;
  int local_380;
  int local_37c;
  Mat local_378;
  Mat *local_338;
  Option *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  Mat *in_stack_fffffffffffffcf8;
  Pooling *in_stack_fffffffffffffd00;
  int local_2f0;
  int local_2e4;
  int local_2dc;
  int local_2d8;
  float local_2d4;
  int local_2cc;
  int local_2c4;
  Mat local_2c0;
  allocator_type *local_280;
  Mat local_278;
  int local_238;
  int local_234;
  int local_230;
  float local_22c;
  int local_228;
  float local_224;
  float *local_220;
  int local_218;
  int local_214;
  Mat local_210;
  float *local_1d0;
  Mat local_1c8;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  reference local_170;
  vector<int,_std::allocator<int>_> local_160;
  int local_148;
  int local_144;
  int local_140;
  undefined4 local_13c;
  Mat local_138;
  int local_f8;
  float local_f4;
  Mat local_f0;
  float *local_b0;
  int local_a8;
  int local_a4;
  float local_a0 [4];
  Mat local_90;
  float *local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  long local_18;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  if (*(int *)(in_RDI + 0xdc) == 0) {
    local_18 = in_RSI;
    Mat::Mat(&local_138);
    make_padding(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffce8);
    bVar2 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar2) {
      local_4 = -100;
      local_13c = 1;
    }
    else {
      local_2c = local_138.w;
      local_30 = local_138.h;
      local_140 = (local_138.w - *(int *)(in_RDI + 0xbc)) / *(int *)(in_RDI + 0xc4) + 1;
      local_144 = (local_138.h - *(int *)(in_RDI + 0xc0)) / *(int *)(in_RDI + 200) + 1;
      Mat::create(in_stack_fffffffffffffc00,(int)(in_stack_fffffffffffffbf8 >> 0x20),
                  (int)in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
                  (size_t)in_stack_fffffffffffffbe8,(Allocator *)in_stack_fffffffffffffbe0);
      bVar2 = Mat::empty(in_stack_fffffffffffffbe0);
      if (bVar2) {
        local_4 = -100;
        local_13c = 1;
      }
      else {
        local_148 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
        std::allocator<int>::allocator((allocator<int> *)0x152a9e);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
                   in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        std::allocator<int>::~allocator((allocator<int> *)0x152ac4);
        local_170 = std::vector<int,_std::allocator<int>_>::operator[](&local_160,0);
        local_174 = 0;
        local_178 = 0;
        local_17c = local_2c - *(int *)(in_RDI + 0xbc);
        for (local_180 = 0; local_180 < *(int *)(in_RDI + 0xc0); local_180 = local_180 + 1) {
          for (local_184 = 0; local_184 < *(int *)(in_RDI + 0xbc); local_184 = local_184 + 1) {
            local_170[local_174] = local_178;
            local_174 = local_174 + 1;
            local_178 = local_178 + 1;
          }
          local_178 = local_17c + local_178;
        }
        if (*(int *)(in_RDI + 0xb8) == 0) {
          for (local_188 = 0; local_188 < local_34; local_188 = local_188 + 1) {
            Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
            Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
            pfVar4 = Mat::operator_cast_to_float_(&local_210);
            Mat::~Mat((Mat *)0x152c88);
            local_1d0 = pfVar4;
            for (local_214 = 0; local_214 < local_144; local_214 = local_214 + 1) {
              for (local_218 = 0; local_218 < local_140; local_218 = local_218 + 1) {
                local_220 = Mat::row(&local_1c8,local_214 * *(int *)(in_RDI + 200));
                local_220 = local_220 + local_218 * *(int *)(in_RDI + 0xc4);
                local_224 = *local_220;
                for (local_228 = 0; local_228 < local_148; local_228 = local_228 + 1) {
                  local_22c = local_220[local_170[local_228]];
                  pfVar4 = std::max<float>(&local_224,&local_22c);
                  local_224 = *pfVar4;
                }
                local_1d0[local_218] = local_224;
              }
              local_1d0 = local_1d0 + local_140;
            }
            Mat::~Mat((Mat *)0x152e9b);
          }
        }
        else if (*(int *)(in_RDI + 0xb8) == 1) {
          if (*(int *)(in_RDI + 0xe4) == 0) {
            local_230 = 0;
            local_234 = 0;
            if (*(int *)(in_RDI + 0xe0) == 0) {
              local_230 = ((local_138.w - *(int *)(local_18 + 0x2c)) - *(int *)(in_RDI + 0xcc)) -
                          *(int *)(in_RDI + 0xd0);
              local_234 = ((local_138.h - *(int *)(local_18 + 0x30)) - *(int *)(in_RDI + 0xd4)) -
                          *(int *)(in_RDI + 0xd8);
            }
            for (local_238 = 0; local_238 < local_34; local_238 = local_238 + 1) {
              Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20)
                          );
              Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20)
                          );
              in_stack_fffffffffffffbf0 = (allocator_type *)Mat::operator_cast_to_float_(&local_2c0)
              ;
              Mat::~Mat((Mat *)0x152fe7);
              local_280 = in_stack_fffffffffffffbf0;
              for (local_2c4 = 0; local_2c4 < local_144; local_2c4 = local_2c4 + 1) {
                iVar6 = *(int *)(in_RDI + 200);
                for (local_2cc = 0; local_2cc < local_140; local_2cc = local_2cc + 1) {
                  iVar1 = *(int *)(in_RDI + 0xc4);
                  local_2d4 = 0.0;
                  local_2d8 = 0;
                  for (local_2dc = 0; local_2dc < *(int *)(in_RDI + 0xc0); local_2dc = local_2dc + 1
                      ) {
                    y = local_2c4 * iVar6 + local_2dc;
                    if (*(int *)(in_RDI + 0xd4) <= y) {
                      if ((local_30 - *(int *)(in_RDI + 0xd8)) - local_234 <= y) break;
                      for (local_2e4 = 0; local_2e4 < *(int *)(in_RDI + 0xbc);
                          local_2e4 = local_2e4 + 1) {
                        iVar3 = local_2cc * iVar1 + local_2e4;
                        if (*(int *)(in_RDI + 0xcc) <= iVar3) {
                          if ((local_2c - *(int *)(in_RDI + 0xd0)) - local_230 <= iVar3) break;
                          in_stack_fffffffffffffbe8 = (Mat *)Mat::row(&local_278,y);
                          local_2d4 = *(float *)((long)&in_stack_fffffffffffffbe8->data +
                                                (long)iVar3 * 4) + local_2d4;
                          local_2d8 = local_2d8 + 1;
                        }
                      }
                    }
                  }
                  *(float *)(local_280 + (long)local_2cc * 4) = local_2d4 / (float)local_2d8;
                }
                local_280 = local_280 + (long)local_140 * 4;
              }
              Mat::~Mat((Mat *)0x1532da);
            }
          }
          else {
            for (local_2f0 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                local_2f0 < local_34; local_2f0 = local_2f0 + 1) {
              Mat::channel(in_stack_fffffffffffffbe8,iVar6);
              Mat::channel(in_stack_fffffffffffffbe8,iVar6);
              in_stack_fffffffffffffbe0 = (Mat *)Mat::operator_cast_to_float_(&local_378);
              Mat::~Mat((Mat *)0x153383);
              local_338 = in_stack_fffffffffffffbe0;
              for (local_37c = 0; local_37c < local_144; local_37c = local_37c + 1) {
                for (local_380 = 0; local_380 < local_140; local_380 = local_380 + 1) {
                  pfVar4 = Mat::row((Mat *)&stack0xfffffffffffffcd0,
                                    local_37c * *(int *)(in_RDI + 200));
                  local_38c = 0.0;
                  for (local_390 = 0; local_390 < local_148; local_390 = local_390 + 1) {
                    local_38c = pfVar4[(long)(local_380 * *(int *)(in_RDI + 0xc4)) +
                                       (long)local_170[local_390]] + local_38c;
                  }
                  *(float *)((long)&local_338->data + (long)local_380 * 4) =
                       local_38c / (float)local_148;
                }
                local_338 = (Mat *)((long)&local_338->data + (long)local_140 * 4);
              }
              Mat::~Mat((Mat *)0x15356c);
            }
          }
        }
        local_4 = 0;
        local_13c = 1;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbf0);
      }
    }
    Mat::~Mat((Mat *)0x1535d8);
  }
  else {
    local_20 = in_RDX;
    Mat::create(in_stack_fffffffffffffc00,(int)(in_stack_fffffffffffffbf8 >> 0x20),
                (size_t)in_stack_fffffffffffffbf0,(Allocator *)in_stack_fffffffffffffbe8);
    bVar2 = Mat::empty(in_stack_fffffffffffffbe0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      local_44 = local_2c * local_30;
      if (*(int *)(in_RDI + 0xb8) == 0) {
        for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
          Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          pfVar4 = Mat::operator_cast_to_float_(&local_90);
          Mat::~Mat((Mat *)0x1526a5);
          local_a0[0] = *pfVar4;
          local_50 = pfVar4;
          for (local_a4 = 0; fVar5 = local_a0[0], local_a4 < local_44; local_a4 = local_a4 + 1) {
            pfVar4 = std::max<float>(local_a0,local_50 + local_a4);
            local_a0[0] = *pfVar4;
          }
          pfVar4 = Mat::operator[](local_20,(long)local_48);
          *pfVar4 = fVar5;
        }
      }
      else if (*(int *)(in_RDI + 0xb8) == 1) {
        for (local_a8 = 0; local_a8 < local_34; local_a8 = local_a8 + 1) {
          Mat::channel(in_stack_fffffffffffffbe8,(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
          pfVar4 = Mat::operator_cast_to_float_(&local_f0);
          Mat::~Mat((Mat *)0x15280b);
          local_f4 = 0.0;
          for (local_f8 = 0; local_f8 < local_44; local_f8 = local_f8 + 1) {
            local_f4 = pfVar4[local_f8] + local_f4;
          }
          fVar5 = local_f4 / (float)local_44;
          local_b0 = pfVar4;
          pfVar4 = Mat::operator[](local_20,(long)local_a8);
          *pfVar4 = fVar5;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}